

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.h
# Opt level: O0

undefined8 L_O_G_NS_GET_TIME::get_time_abi_cxx11_(void)

{
  _Setfill<char> _Var1;
  _Setw _Var2;
  tm *__tmb;
  basic_ostream<char,_std::char_traits<char>_> *pbVar3;
  ostream *poVar4;
  rep rVar5;
  undefined8 in_RDI;
  _Put_time<char> __f;
  stringstream local_1c8 [8];
  stringstream ss;
  basic_ostream<char,_std::char_traits<char>_> local_1b8 [380];
  int local_3c;
  duration<long,_std::ratio<1L,_1000000000L>_> local_38;
  duration<long,_std::ratio<1L,_1000L>_> local_30;
  duration<long,_std::ratio<1L,_1000L>_> local_28;
  duration<long,_std::ratio<1L,_1000L>_> ms;
  time_t time;
  time_point now;
  
  time = std::chrono::_V2::system_clock::now();
  ms.__r = std::chrono::_V2::system_clock::to_time_t((time_point *)&time);
  local_38.__r = (rep)std::chrono::
                      time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                      ::time_since_epoch((time_point *)&time);
  local_30.__r = (rep)std::chrono::
                      duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                                (&local_38);
  local_3c = 1000;
  local_28 = std::chrono::operator%(&local_30,&local_3c);
  std::__cxx11::stringstream::stringstream(local_1c8);
  __tmb = localtime(&ms.__r);
  __f = std::put_time<char>((tm *)__tmb,"%Y-%m-%d %H:%M:%S");
  pbVar3 = std::operator<<(local_1b8,__f);
  poVar4 = std::operator<<((ostream *)pbVar3,'.');
  _Var2 = std::setw(3);
  poVar4 = std::operator<<(poVar4,_Var2);
  _Var1 = std::setfill<char>('0');
  poVar4 = std::operator<<(poVar4,_Var1._M_c);
  rVar5 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_28);
  std::ostream::operator<<(poVar4,rVar5);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1c8);
  return in_RDI;
}

Assistant:

static inline std::string get_time() {
  auto now = std::chrono::system_clock::now();
  std::time_t time = std::chrono::system_clock::to_time_t(now);
  auto ms = std::chrono::duration_cast<std::chrono::milliseconds>(now.time_since_epoch()) % 1000;
  std::stringstream ss;
  ss << std::put_time(std::localtime(&time), "%Y-%m-%d %H:%M:%S") << '.' << std::setw(3) << std::setfill('0') << ms.count();
  return ss.str();
}